

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

bool __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,Job *data)

{
  Node *pNVar1;
  usize uVar2;
  ulong local_38;
  usize tail;
  usize next;
  Node *node;
  Job *data_local;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_local;
  
  uVar2 = this->_tail;
  do {
    local_38 = uVar2;
    pNVar1 = this->_queue + (local_38 & this->_capacityMask);
    if (pNVar1->tail != local_38) {
      return false;
    }
    uVar2 = Atomic::compareAndSwap(&this->_tail,local_38,local_38 + 1);
  } while (uVar2 != local_38);
  (pNVar1->data).proc = data->proc;
  (pNVar1->data).args = data->args;
  Atomic::swap(&pNVar1->head,local_38);
  return true;
}

Assistant:

inline bool Future<void>::Private::LockFreeQueue<T>::push(const T &data)
{
  Node *node;
  usize next, tail = _tail;
  for (;; tail = next)
  {
    node = &_queue[tail & _capacityMask];
    if (node->tail != tail)
      return false;
    if ((next = Atomic::compareAndSwap(_tail, tail, tail + 1)) == tail)
      break;
  }
  new (&node->data) T(data);
  Atomic::swap(node->head, tail);
  return true;
}